

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O2

void test_ctranslate(string *c,string *original,string *expected,locale *l,string *domain)

{
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)c);
  std::__cxx11::string::string((string *)&local_90,(string *)original);
  std::__cxx11::string::string((string *)&local_b0,(string *)expected);
  std::__cxx11::string::string((string *)&local_d0,(string *)domain);
  strings_equal<char>(&local_50,&local_90,&local_b0,l,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,(string *)c);
  std::__cxx11::string::string((string *)&local_f0,(string *)original);
  std::__cxx11::string::string((string *)&local_110,(string *)expected);
  std::__cxx11::string::string((string *)&local_130,(string *)domain);
  strings_equal<wchar_t>(&local_70,&local_f0,&local_110,l,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void test_ctranslate(std::string c,std::string original,std::string expected,std::locale const &l,std::string domain)
{
    strings_equal<char>(c,original,expected,l,domain);
    strings_equal<wchar_t>(c,original,expected,l,domain);
    #ifdef BOOSTER_HAS_CHAR16_T
    if(backend=="icu" || backend=="std")
        strings_equal<char16_t>(c,original,expected,l,domain);
    #endif
    #ifdef BOOSTER_HAS_CHAR32_T
    if(backend=="icu" || backend=="std")
        strings_equal<char32_t>(c,original,expected,l,domain);
    #endif
}